

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

lzma_ret lzma_lzma_decoder_create
                   (lzma_lz_decoder_conflict1 *lz,lzma_allocator *allocator,void *opt,
                   lzma_lz_options *lz_options)

{
  lzma_coder_conflict8 *plVar1;
  
  if (lz->coder == (lzma_coder_conflict8 *)0x0) {
    plVar1 = (lzma_coder_conflict8 *)lzma_alloc(0x6ec0,allocator);
    lz->coder = plVar1;
    if (plVar1 == (lzma_coder_conflict8 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->code = lzma_decode;
    lz->reset = lzma_decoder_reset;
    lz->set_uncompressed = lzma_decoder_uncompressed;
  }
  lz_options->dict_size = (ulong)*opt;
  lz_options->preset_dict = *(uint8_t **)((long)opt + 8);
  lz_options->preset_dict_size = (ulong)*(uint *)((long)opt + 0x10);
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_lzma_decoder_create(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	const lzma_options_lzma *options = opt;

	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma_decode;
		lz->reset = &lzma_decoder_reset;
		lz->set_uncompressed = &lzma_decoder_uncompressed;
	}

	// All dictionary sizes are OK here. LZ decoder will take care of
	// the special cases.
	lz_options->dict_size = options->dict_size;
	lz_options->preset_dict = options->preset_dict;
	lz_options->preset_dict_size = options->preset_dict_size;

	return LZMA_OK;
}